

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

reference __thiscall
slang::SmallVectorBase<slang::ast::OpaqueInstancePath::Entry>::
emplace_back<slang::ast::OpaqueInstancePath::Entry>
          (SmallVectorBase<slang::ast::OpaqueInstancePath::Entry> *this,Entry *args)

{
  pointer __src;
  pointer pEVar1;
  size_type sVar2;
  ulong uVar3;
  pointer pEVar4;
  pointer pEVar5;
  pointer pEVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  pEVar1 = this->data_;
  __src = pEVar1 + this->len;
  if (this->len != this->cap) {
    __src->value = args->value;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return pEVar1 + sVar2;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  uVar8 = this->len + 1;
  uVar3 = this->cap;
  if (uVar8 < uVar3 * 2) {
    uVar8 = uVar3 * 2;
  }
  if (0xfffffffffffffff - uVar3 < uVar3) {
    uVar8 = 0xfffffffffffffff;
  }
  lVar9 = (long)__src - (long)this->data_;
  pEVar6 = (pointer)operator_new(uVar8 * 8);
  *(uintptr_t *)((long)pEVar6 + lVar9) = args->value;
  pEVar1 = this->data_;
  sVar2 = this->len;
  lVar7 = (long)pEVar1 + (sVar2 * 8 - (long)__src);
  pEVar4 = pEVar1;
  pEVar5 = pEVar6;
  if (lVar7 == 0) {
    if (sVar2 != 0) {
      lVar7 = 0;
      do {
        *(undefined8 *)((long)&pEVar6->value + lVar7) =
             *(undefined8 *)((long)&pEVar1->value + lVar7);
        lVar7 = lVar7 + 8;
      } while (sVar2 << 3 != lVar7);
    }
  }
  else {
    for (; pEVar4 != __src; pEVar4 = pEVar4 + 1) {
      pEVar5->value = pEVar4->value;
      pEVar5 = pEVar5 + 1;
    }
    memcpy((void *)((long)pEVar6 + lVar9 + 8),__src,(lVar7 - 8U & 0xfffffffffffffff8) + 8);
  }
  if (pEVar1 != (pointer)this->firstElement) {
    operator_delete(pEVar1);
  }
  this->len = this->len + 1;
  this->cap = uVar8;
  this->data_ = pEVar6;
  return (reference)((long)pEVar6 + lVar9);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }